

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O2

void idx2::Init(brick_pool *Bp,idx2_file *Idx2)

{
  u64 uVar1;
  undefined4 in_R8D;
  v3i Brick3;
  
  Bp->Idx2 = Idx2;
  Brick3.field_0._0_4_ = (Idx2->NBricks3).Arr[0].field_0.field_0.Z - 1;
  Brick3.field_0.field_0.Y = 0;
  Brick3.field_0.field_0.Z = in_R8D;
  uVar1 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)0x0,
                         (Idx2->NBricks3).Arr[0].field_0.field_0.X + -1,Brick3);
  Mallocator();
  Init<unsigned_long,idx2::brick_volume>(&Bp->BrickTable,10,&Mallocator::Instance.super_allocator);
  Resize<signed_char>(&Bp->ResolutionLevels,uVar1 + 1);
  return;
}

Assistant:

void
Init(brick_pool* Bp, const idx2_file* Idx2)
{
  Bp->Idx2 = Idx2;
  i64 NFinestBricks = 1 + GetLinearBrick(*Idx2, 0, Idx2->NBricks3[0] - 1);
  Init(&Bp->BrickTable, 10);
  Resize(&Bp->ResolutionLevels, NFinestBricks);
}